

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_verify_restartable
              (mbedtls_ecp_group *grp,uchar *buf,size_t blen,mbedtls_ecp_point *Q,mbedtls_mpi *r,
              mbedtls_mpi *s,mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  mbedtls_mpi *Y;
  int iVar1;
  int iVar2;
  undefined1 local_c0 [8];
  mbedtls_ecp_point R;
  mbedtls_mpi e;
  undefined1 local_70 [8];
  mbedtls_mpi s_inv;
  mbedtls_mpi u1;
  mbedtls_mpi u2;
  
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_c0);
  mbedtls_mpi_init((mbedtls_mpi *)&R.Z.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_70);
  mbedtls_mpi_init((mbedtls_mpi *)&s_inv.s);
  mbedtls_mpi_init((mbedtls_mpi *)&u1.s);
  if ((grp->N).p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  iVar1 = mbedtls_mpi_cmp_int(r,1);
  if (-1 < iVar1) {
    Y = &grp->N;
    iVar1 = mbedtls_mpi_cmp_mpi(r,Y);
    if (((iVar1 < 0) && (iVar1 = mbedtls_mpi_cmp_int(s,1), -1 < iVar1)) &&
       (iVar1 = mbedtls_mpi_cmp_mpi(s,Y), iVar1 < 0)) {
      iVar1 = derive_mpi(grp,(mbedtls_mpi *)&R.Z.s,buf,blen);
      if (((((iVar1 == 0) && (iVar1 = mbedtls_mpi_inv_mod((mbedtls_mpi *)local_70,s,Y), iVar1 == 0))
           && ((iVar1 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&s_inv.s,(mbedtls_mpi *)&R.Z.s,
                                            (mbedtls_mpi *)local_70), iVar1 == 0 &&
               ((iVar1 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&s_inv.s,(mbedtls_mpi *)&s_inv.s,Y),
                iVar1 == 0 &&
                (iVar1 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&u1.s,r,(mbedtls_mpi *)local_70),
                iVar1 == 0)))))) &&
          (iVar1 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&u1.s,(mbedtls_mpi *)&u1.s,Y), iVar1 == 0)) &&
         (iVar1 = mbedtls_ecp_muladd_restartable
                            (grp,(mbedtls_ecp_point *)local_c0,(mbedtls_mpi *)&s_inv.s,&grp->G,
                             (mbedtls_mpi *)&u1.s,Q,(mbedtls_ecp_restart_ctx *)0x0), iVar1 == 0)) {
        iVar2 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)local_c0);
        iVar1 = -0x4e00;
        if ((iVar2 == 0) &&
           (iVar1 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_c0,(mbedtls_mpi *)local_c0,Y),
           iVar1 == 0)) {
          iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_c0,r);
          iVar1 = -0x4e00;
          if (iVar2 == 0) {
            iVar1 = 0;
          }
        }
      }
      goto LAB_001bc722;
    }
  }
  iVar1 = -0x4e00;
LAB_001bc722:
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_c0);
  mbedtls_mpi_free((mbedtls_mpi *)&R.Z.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_70);
  mbedtls_mpi_free((mbedtls_mpi *)&s_inv.s);
  mbedtls_mpi_free((mbedtls_mpi *)&u1.s);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_verify_restartable(mbedtls_ecp_group *grp,
                                     const unsigned char *buf, size_t blen,
                                     const mbedtls_ecp_point *Q,
                                     const mbedtls_mpi *r,
                                     const mbedtls_mpi *s,
                                     mbedtls_ecdsa_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi e, s_inv, u1, u2;
    mbedtls_ecp_point R;
    mbedtls_mpi *pu1 = &u1, *pu2 = &u2;

    mbedtls_ecp_point_init(&R);
    mbedtls_mpi_init(&e); mbedtls_mpi_init(&s_inv);
    mbedtls_mpi_init(&u1); mbedtls_mpi_init(&u2);

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if (!mbedtls_ecdsa_can_do(grp->id) || grp->N.p == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    ECDSA_RS_ENTER(ver);

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->ver != NULL) {
        /* redirect to our context */
        pu1 = &rs_ctx->ver->u1;
        pu2 = &rs_ctx->ver->u2;

        /* jump to current step */
        if (rs_ctx->ver->state == ecdsa_ver_muladd) {
            goto muladd;
        }
    }
#endif /* MBEDTLS_ECP_RESTARTABLE */

    /*
     * Step 1: make sure r and s are in range 1..n-1
     */
    if (mbedtls_mpi_cmp_int(r, 1) < 0 || mbedtls_mpi_cmp_mpi(r, &grp->N) >= 0 ||
        mbedtls_mpi_cmp_int(s, 1) < 0 || mbedtls_mpi_cmp_mpi(s, &grp->N) >= 0) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Step 3: derive MPI from hashed message
     */
    MBEDTLS_MPI_CHK(derive_mpi(grp, &e, buf, blen));

    /*
     * Step 4: u1 = e / s mod n, u2 = r / s mod n
     */
    ECDSA_BUDGET(MBEDTLS_ECP_OPS_CHK + MBEDTLS_ECP_OPS_INV + 2);

    MBEDTLS_MPI_CHK(mbedtls_mpi_inv_mod(&s_inv, s, &grp->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(pu1, &e, &s_inv));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(pu1, pu1, &grp->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(pu2, r, &s_inv));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(pu2, pu2, &grp->N));

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->ver != NULL) {
        rs_ctx->ver->state = ecdsa_ver_muladd;
    }

muladd:
#endif
    /*
     * Step 5: R = u1 G + u2 Q
     */
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd_restartable(grp,
                                                   &R, pu1, &grp->G, pu2, Q, ECDSA_RS_ECP));

    if (mbedtls_ecp_is_zero(&R)) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Step 6: convert xR to an integer (no-op)
     * Step 7: reduce xR mod n (gives v)
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&R.X, &R.X, &grp->N));

    /*
     * Step 8: check if v (that is, R.X) is equal to r
     */
    if (mbedtls_mpi_cmp_mpi(&R.X, r) != 0) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free(&R);
    mbedtls_mpi_free(&e); mbedtls_mpi_free(&s_inv);
    mbedtls_mpi_free(&u1); mbedtls_mpi_free(&u2);

    ECDSA_RS_LEAVE(ver);

    return ret;
}